

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O1

void __thiscall CodeGenerator::writeSignalImplDefine(CodeGenerator *this,ostream *s,Class *clazz)

{
  pointer pSVar1;
  pointer pcVar2;
  char cVar3;
  size_type *psVar4;
  int iVar5;
  ostream *poVar6;
  Signal *sig;
  pointer pSVar7;
  pointer pPVar8;
  size_type *local_58;
  string name;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"// Signal definitions",0x15);
  cVar3 = (char)s;
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar3);
  std::ostream::put(cVar3);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#define RENGINE_DEFINE_SIGNALS_",0x1f);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," \\",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pSVar1 = (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar7 = (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar7 != pSVar1; pSVar7 = pSVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(s,"    rengine::Signal<",0x14);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (s,(pSVar7->signature)._M_dataplus._M_p,(pSVar7->signature)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"> ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"::",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(pSVar7->name)._M_dataplus._M_p,(pSVar7->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
  }
  pPVar8 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
           super__Vector_impl_data._M_start;
  name.field_2._8_8_ =
       (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pPVar8 != (pointer)name.field_2._8_8_) {
    do {
      pcVar2 = (pPVar8->name)._M_dataplus._M_p;
      local_58 = &name._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (pPVar8->name)._M_string_length);
      psVar4 = local_58;
      iVar5 = toupper((int)(char)*local_58);
      *(char *)psVar4 = (char)iVar5;
      std::__ostream_insert<char,std::char_traits<char>>(s,"    rengine::Signal<> ",0x16);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (s,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"::on",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_58,(long)name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Changed;",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_58 != &name._M_string_length) {
        operator_delete(local_58);
      }
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != (pointer)name.field_2._8_8_);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void CodeGenerator::writeSignalImplDefine(std::ostream &s, Class *clazz)
{
    // ### Won't work with classes in namespaces, but then again, that will
    // need changes all around..
    s << "// Signal definitions" << std::endl
      << "#define RENGINE_DEFINE_SIGNALS_" << clazz->name << " \\" << std::endl;
    for (const Signal &sig : clazz->signals)
        s << "    rengine::Signal<" << sig.signature << "> " << clazz->name << "::" << sig.name << ";";
    for (const Property &prop : clazz->properties) {
        std::string name = prop.name;
        name[0] = std::toupper(name[0]);
        s << "    rengine::Signal<> " << clazz->name << "::on" << name << "Changed;" << std::endl;
    }
    // for (const Replicator &r : clazz->replicators)
    //     s << "    rengine::Signal<> " << clazz->name << "::Replicator_" << r.id << "::onCountChanged;";

    s << std::endl;
}